

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

void __thiscall
GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceHandle fh,double radius,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor)

{
  _Map_pointer *this_00;
  pointer pFVar1;
  int iVar2;
  int i;
  long lVar3;
  reference rVar4;
  undefined1 local_118 [8];
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  vector<bool,_std::allocator<bool>_> flag;
  Point ci;
  Point cj;
  undefined1 auStack_58 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> temp_face_neighbor;
  BaseHandle local_38;
  FaceHandle fh_local;
  FaceHandle temp_face_handle_queue;
  FaceHandle temp_face_handle;
  
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = fh.super_BaseHandle.idx_;
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::calc_face_centroid
            ((Point *)&flag.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,
             (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)mesh,(FaceHandle)fh.super_BaseHandle.idx_);
  iVar2 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  local_118[0] = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node,(long)iVar2,(bool *)local_118,
             (allocator_type *)auStack_58);
  pFVar1 = (face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar1) {
    (face_neighbor->super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)
                     &queue_face_handle.c.
                      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node,
                     (long)(int)fh.super_BaseHandle.idx_);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  std::
  queue<OpenMesh::FaceHandle,std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>>
  ::queue<std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>,void>
            ((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
              *)local_118);
  std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
            ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_118,
             (value_type *)
             ((long)&temp_face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  auStack_58 = (undefined1  [8])0x0;
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  while (queue_face_handle.c.
         super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         queue_face_handle.c.
         super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Deque_impl_data._M_map_size) {
    local_38.idx_ =
         *(int *)queue_face_handle.c.
                 super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Deque_impl_data._M_map_size;
    if (local_38.idx_ !=
        temp_face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_) {
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                (face_neighbor,(value_type *)&local_38);
    }
    std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::pop_front
              ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_118);
    getVertexBasedFaceNeighbor
              (this,mesh,(FaceHandle)local_38.idx_,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58);
    for (lVar3 = 0;
        lVar3 < (int)((ulong)((long)temp_face_neighbor.
                                    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) >>
                     2); lVar3 = lVar3 + 1) {
      fh_local.super_BaseHandle.idx_ =
           (BaseHandle)(((pointer)((long)auStack_58 + lVar3 * 4))->super_BaseHandle).idx_;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)this_00,
                         (long)(int)fh_local.super_BaseHandle.idx_);
      if ((*rVar4._M_p & rVar4._M_mask) == 0) {
        OpenMesh::
        PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        ::calc_face_centroid
                  ((Point *)(ci.super_VectorDataT<double,_3>.values_ + 2),
                   (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    *)mesh,(FaceHandle)fh_local.super_BaseHandle.idx_);
        if (SQRT((ci.super_VectorDataT<double,_3>.values_[1] -
                 cj.super_VectorDataT<double,_3>.values_[1]) *
                 (ci.super_VectorDataT<double,_3>.values_[1] -
                 cj.super_VectorDataT<double,_3>.values_[1]) +
                 ((double)flag.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                 ci.super_VectorDataT<double,_3>.values_[2]) *
                 ((double)flag.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                 ci.super_VectorDataT<double,_3>.values_[2]) +
                 (ci.super_VectorDataT<double,_3>.values_[0] -
                 cj.super_VectorDataT<double,_3>.values_[0]) *
                 (ci.super_VectorDataT<double,_3>.values_[0] -
                 cj.super_VectorDataT<double,_3>.values_[0])) <= radius) {
          std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                    ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_118
                     ,&fh_local);
        }
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)this_00,
                           (long)(int)fh_local.super_BaseHandle.idx_);
        *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
      }
    }
  }
  std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Vector_base
            ((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58
            );
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Deque_base
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_118);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)
             &queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node);
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor(TriMesh &mesh, TriMesh::FaceHandle fh, double radius, std::vector<TriMesh::FaceHandle> &face_neighbor)
{
    TriMesh::Point ci = mesh.calc_face_centroid(fh);
    std::vector<bool> flag((int)mesh.n_faces(), false);

    face_neighbor.clear();
    flag[fh.idx()] = true;
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    queue_face_handle.push(fh);

    std::vector<TriMesh::FaceHandle> temp_face_neighbor;
    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle temp_face_handle_queue = queue_face_handle.front();
        if(temp_face_handle_queue != fh)
            face_neighbor.push_back(temp_face_handle_queue);
        queue_face_handle.pop();
        getVertexBasedFaceNeighbor(mesh, temp_face_handle_queue, temp_face_neighbor);
        for(int i = 0; i < (int)temp_face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_face_handle = temp_face_neighbor[i];
            if(!flag[temp_face_handle.idx()])
            {
                TriMesh::Point cj = mesh.calc_face_centroid(temp_face_handle);
                double distance = (ci - cj).length();
                if(distance <= radius)
                    queue_face_handle.push(temp_face_handle);
                flag[temp_face_handle.idx()] = true;
            }
        }
    }
}